

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccnr.cc
# Opt level: O2

bool __thiscall CCNR::ls_solver::make_space(ls_solver *this)

{
  bool bVar1;
  ostream *poVar2;
  
  if ((this->_num_vars == 0) || (this->_num_clauses == 0)) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "c the formula size is zero. You may forgot to read the formula.");
    std::endl<char,std::char_traits<char>>(poVar2);
    bVar1 = false;
  }
  else {
    std::vector<CCNR::variable,_std::allocator<CCNR::variable>_>::resize
              (&this->_vars,this->_num_vars + (long)this->_additional_len);
    std::vector<CCNR::clause,_std::allocator<CCNR::clause>_>::resize
              (&this->_clauses,(long)this->_additional_len + this->_num_clauses);
    std::vector<char,_std::allocator<char>_>::resize
              (&this->_solution,(long)this->_additional_len + this->_num_vars);
    std::vector<char,_std::allocator<char>_>::resize
              (&this->_best_solution,(long)this->_additional_len + this->_num_vars);
    std::vector<int,_std::allocator<int>_>::resize
              (&this->_index_in_unsat_clauses,(long)this->_additional_len + this->_num_clauses);
    std::vector<int,_std::allocator<int>_>::resize
              (&this->_index_in_unsat_vars,(long)this->_additional_len + this->_num_vars);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool ls_solver::make_space()
{
    if (0 == _num_vars || 0 == _num_clauses) {
        cout << "c the formula size is zero. You may forgot to read the formula." << endl;
        return false;
    }
    // _vars.reserve(_num_vars+_additional_len);
    // _clauses.reserve(_num_clauses+_additional_len);
    // _solution.reserve(_num_vars+_additional_len);
    // _index_in_unsat_clauses.reserve(_num_clauses+_additional_len);
    // _index_in_unsat_vars.reserve(_num_vars+_additional_len);
    _vars.resize(_num_vars + _additional_len);
    _clauses.resize(_num_clauses + _additional_len);
    _solution.resize(_num_vars + _additional_len);
    _best_solution.resize(_num_vars + _additional_len);
    _index_in_unsat_clauses.resize(_num_clauses + _additional_len);
    _index_in_unsat_vars.resize(_num_vars + _additional_len);

    return true;
}